

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3ExprAnd(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  sqlite3 *db;
  Expr *pEVar1;
  long in_FS_OFFSET;
  Token local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar1 = pRight;
  if ((pLeft != (Expr *)0x0) && (pEVar1 = pLeft, pRight != (Expr *)0x0)) {
    if ((((pRight->flags | pLeft->flags) & 0x20000003) != 0x20000000) || (1 < pParse->eParseMode)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pEVar1 = sqlite3PExpr(pParse,0x2c,pLeft,pRight);
        return pEVar1;
      }
      goto LAB_0016f490;
    }
    db = pParse->db;
    sqlite3ParserAddCleanup(pParse,sqlite3ExprDeleteGeneric,pLeft);
    sqlite3ParserAddCleanup(pParse,sqlite3ExprDeleteGeneric,pRight);
    local_38.n = 1;
    local_38._12_4_ = 0xaaaaaaaa;
    local_38.z = "0";
    pEVar1 = sqlite3ExprAlloc(db,0x9c,&local_38,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pEVar1;
  }
LAB_0016f490:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(Parse *pParse, Expr *pLeft, Expr *pRight){
  sqlite3 *db = pParse->db;
  if( pLeft==0  ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else{
    u32 f = pLeft->flags | pRight->flags;
    if( (f&(EP_OuterON|EP_InnerON|EP_IsFalse))==EP_IsFalse
     && !IN_RENAME_OBJECT
    ){
      sqlite3ExprDeferredDelete(pParse, pLeft);
      sqlite3ExprDeferredDelete(pParse, pRight);
      return sqlite3Expr(db, TK_INTEGER, "0");
    }else{
      return sqlite3PExpr(pParse, TK_AND, pLeft, pRight);
    }
  }
}